

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Qualifiers __thiscall anon_unknown.dwarf_6027d3::Db::parseCVQualifiers(Db *this)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  Qualifiers QVar4;
  Qualifiers QVar5;
  Qualifiers QVar6;
  
  pcVar1 = this->First;
  pcVar2 = this->Last;
  QVar5 = QualNone;
  if ((pcVar1 != pcVar2) && (QVar5 = QualNone, *pcVar1 == 'r')) {
    this->First = pcVar1 + 1;
    QVar5 = QualRestrict;
  }
  pcVar1 = this->First;
  if ((pcVar1 == pcVar2) || (*pcVar1 != 'V')) {
    bVar3 = false;
  }
  else {
    this->First = pcVar1 + 1;
    bVar3 = true;
  }
  pcVar1 = this->First;
  QVar6 = QualNone;
  if ((pcVar1 != pcVar2) && (QVar6 = QualNone, *pcVar1 == 'K')) {
    this->First = pcVar1 + 1;
    QVar6 = QualConst;
  }
  QVar4 = QVar5 | QualVolatile;
  if (!bVar3) {
    QVar4 = QVar5;
  }
  return QVar4 | QVar6;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }